

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O0

void DrawerCommandQueue::QueueCommand<swrenderer::DrawWallMasked4PalCommand>(void)

{
  DrawWallMasked4PalCommand *this;
  bool bVar1;
  _func_void_void_ptr *tryBlock;
  _func_void_void_ptr_char_ptr_bool *catchBlock;
  value_type local_d8;
  DrawWallMasked4PalCommand *local_d0;
  DrawWallMasked4PalCommand *command_1;
  void *ptr;
  _lambda_void__char_const__bool__1_ local_aa;
  _lambda_void___1_ local_a9;
  undefined1 auStack_a8 [8];
  DrawWallMasked4PalCommand command;
  DrawerCommandQueue *queue;
  
  command.super_PalWall4Command._destblend = (uint32_t *)Instance();
  if ((((DrawerCommandQueue *)command.super_PalWall4Command._destblend)->threaded_render == 0) ||
     (bVar1 = FBoolCVar::operator_cast_to_bool(&r_multithreaded), !bVar1)) {
    command.super_PalWall4Command._texturefrac[0] = 0;
    command.super_PalWall4Command._texturefrac[1] = 0;
    command.super_PalWall4Command._texturefrac[2] = 0;
    command.super_PalWall4Command._texturefrac[3] = 0;
    command.super_PalWall4Command._iscale[0] = 0;
    command.super_PalWall4Command._iscale[1] = 0;
    command.super_PalWall4Command._iscale[2] = 0;
    command.super_PalWall4Command._iscale[3] = 0;
    command.super_PalWall4Command._source[2] = (uint8_t *)0x0;
    command.super_PalWall4Command._source[3] = (uint8_t *)0x0;
    command.super_PalWall4Command._source[0] = (uint8_t *)0x0;
    command.super_PalWall4Command._source[1] = (uint8_t *)0x0;
    command.super_PalWall4Command._colormap[2] = (uint8_t *)0x0;
    command.super_PalWall4Command._colormap[3] = (uint8_t *)0x0;
    command.super_PalWall4Command._colormap[0] = (uint8_t *)0x0;
    command.super_PalWall4Command._colormap[1] = (uint8_t *)0x0;
    command.super_PalWall4Command._count = 0;
    command.super_PalWall4Command._pitch = 0;
    command.super_PalWall4Command._fracbits = 0;
    command.super_PalWall4Command._36_4_ = 0;
    command.super_PalWall4Command.super_DrawerCommand._dest_y = 0;
    command.super_PalWall4Command.super_DrawerCommand._12_4_ = 0;
    command.super_PalWall4Command._dest = (uint8_t *)0x0;
    auStack_a8 = (undefined1  [8])0x0;
    command.super_PalWall4Command.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)0x0;
    command.super_PalWall4Command._srcblend = (uint32_t *)0x0;
    swrenderer::DrawWallMasked4PalCommand::DrawWallMasked4PalCommand
              ((DrawWallMasked4PalCommand *)auStack_a8);
    tryBlock = QueueCommand()::{lambda(void*)#1}::operator_cast_to_function_pointer(&local_a9);
    catchBlock = QueueCommand()::{lambda(void*,char_const*,bool)#1}::
                 operator_cast_to_function_pointer(&local_aa);
    VectoredTryCatch((DrawWallMasked4PalCommand *)auStack_a8,tryBlock,catchBlock);
    swrenderer::DrawWallMasked4PalCommand::~DrawWallMasked4PalCommand
              ((DrawWallMasked4PalCommand *)auStack_a8);
  }
  else {
    command_1 = (DrawWallMasked4PalCommand *)AllocMemory(0x98);
    if (command_1 == (DrawWallMasked4PalCommand *)0x0) {
      Finish((DrawerCommandQueue *)command.super_PalWall4Command._destblend);
      command_1 = (DrawWallMasked4PalCommand *)AllocMemory(0x98);
      if (command_1 == (DrawWallMasked4PalCommand *)0x0) {
        return;
      }
    }
    this = command_1;
    memset(command_1,0,0x98);
    swrenderer::DrawWallMasked4PalCommand::DrawWallMasked4PalCommand(this);
    local_d0 = this;
    local_d8 = (value_type)this;
    std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::push_back
              ((vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_> *)
               (command.super_PalWall4Command._destblend + 0x400002),&local_d8);
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}